

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sc_report_handler.cpp
# Opt level: O1

void sc_core::sc_report_handler::report
               (sc_severity severity_,char *msg_type_,char *msg_,char *file_,int line_)

{
  sc_msg_def *md;
  sc_actions actions;
  sc_report rep;
  uint local_84;
  sc_report local_80;
  
  md = mdlookup(msg_type_);
  if ((severity_ != SC_INFO) || (199 < verbosity_level)) {
    if (md == (sc_msg_def *)0x0) {
      md = add_msg_type(msg_type_);
    }
    local_84 = execute(md,severity_);
    sc_report::sc_report(&local_80,severity_,md,msg_,file_,line_,200);
    if ((local_84 & 0x10) != 0) {
      cache_report(&local_80);
    }
    (*(code *)handler)(&local_80,&local_84);
    sc_report::~sc_report(&local_80);
  }
  return;
}

Assistant:

void sc_report_handler::report(sc_severity severity_,
			       const char * msg_type_,
			       const char * msg_,
			       const char * file_,
			       int line_)
{
    sc_msg_def * md = mdlookup(msg_type_);

    // If the severity of the report is SC_INFO and the maximum verbosity
    // level is less than SC_MEDIUM return without any action.

    if ( (severity_ == SC_INFO) && (SC_MEDIUM > verbosity_level) ) return;

    // Process the report:


    if ( !md )
	md = add_msg_type(msg_type_);

    sc_actions actions = execute(md, severity_);
    sc_report rep(severity_, md, msg_, file_, line_);

    if ( actions & SC_CACHE_REPORT )
	cache_report(rep);

    handler(rep, actions);
}